

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::
ParameterizedTestFactory<google::protobuf::descriptor_unittest::ExtensionDeclarationsTest_MismatchNonMessageType_Test>
::~ParameterizedTestFactory
          (ParameterizedTestFactory<google::protobuf::descriptor_unittest::ExtensionDeclarationsTest_MismatchNonMessageType_Test>
           *this)

{
  ParameterizedTestFactory<google::protobuf::descriptor_unittest::ExtensionDeclarationsTest_MismatchNonMessageType_Test>
  *this_local;
  
  ~ParameterizedTestFactory(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

explicit ParameterizedTestFactory(ParamType parameter)
      : parameter_(parameter) {}